

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O2

int __thiscall amrex::AmrMesh::GetLevel(AmrMesh *this,Box *domain)

{
  int *piVar1;
  pointer pGVar2;
  undefined8 uVar3;
  bool bVar4;
  int i;
  long lVar5;
  int lev;
  long lVar6;
  Box ccdomain;
  
  ccdomain.smallend.vect._0_8_ = *(undefined8 *)(domain->smallend).vect;
  uVar3 = *(undefined8 *)((domain->smallend).vect + 2);
  ccdomain.bigend.vect[1] = (int)((ulong)*(undefined8 *)(domain->bigend).vect >> 0x20);
  ccdomain._20_8_ = *(undefined8 *)((domain->bigend).vect + 2);
  ccdomain.smallend.vect[2] = (int)uVar3;
  ccdomain.bigend.vect[0] = (int)((ulong)uVar3 >> 0x20);
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    if ((ccdomain.btype.itype >> ((uint)lVar5 & 0x1f) & 1) != 0) {
      piVar1 = ccdomain.bigend.vect + lVar5;
      *piVar1 = *piVar1 + -1;
    }
  }
  ccdomain._20_8_ = ccdomain._20_8_ & 0xffffffff;
  lVar5 = 0xac;
  lVar6 = 0;
  while( true ) {
    pGVar2 = (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
             super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (((long)(this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_finish - (long)pGVar2) / 200 <= lVar6) {
      return -1;
    }
    bVar4 = Box::operator==((Box *)((long)(pGVar2->super_CoordSys).offset +
                                   lVar5 + 0xfffffffffffffff8U),&ccdomain);
    if (bVar4) break;
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 200;
  }
  return (int)lVar6;
}

Assistant:

int
AmrMesh::GetLevel (Box const& domain) noexcept
{
    Box ccdomain = amrex::enclosedCells(domain);
    for (int lev = 0; lev < geom.size(); ++lev) {
        if (geom[lev].Domain() == ccdomain) return lev;
    }
    return -1;
}